

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
libcellml::Parser::ParserImpl::loadReset
          (ParserImpl *this,ResetPtr *reset,ComponentPtr *component,XmlNodePtr *node)

{
  _func_int **pp_Var1;
  Entity *this_00;
  xmlNodePtr this_01;
  IssueImpl *pIVar2;
  _Alloc_hider _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  bool bVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar8;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar5;
  undefined8 *puVar6;
  long *plVar7;
  element_type *peVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type *psVar11;
  undefined8 *puVar12;
  long *plVar13;
  ulong count;
  _func_int **pp_Var14;
  size_t count_00;
  string variableReference;
  IssuePtr issue_5;
  XmlNodePtr childNode;
  XmlAttributePtr attribute;
  IssuePtr issue;
  IssuePtr issue_2;
  int order;
  string local_1a8;
  string local_188;
  string local_160;
  IssuePtr local_140;
  element_type local_130;
  ResetPtr *local_120;
  string local_118;
  undefined1 local_f8 [48];
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  XmlNode local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  string local_a0;
  ulong local_80;
  IssuePtr local_78;
  string local_68;
  int local_44;
  ulong local_40;
  XmlNodePtr *local_38;
  
  local_44 = 0;
  local_120 = reset;
  local_f8._32_8_ = this;
  XmlNode::firstAttribute(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.mPimpl !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_40 = 0;
    local_80 = local_80 & 0xffffffff00000000;
    local_38 = node;
    do {
      paVar10 = &local_188.field_2;
      bVar4 = XmlAttribute::isType((XmlAttribute *)local_b0.mPimpl,"variable","");
      if (bVar4) {
        XmlAttribute::value_abi_cxx11_(&local_188,(XmlAttribute *)local_b0.mPimpl);
        Component::variable((Component *)local_f8,
                            (string *)
                            (component->
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          Issue::IssueImpl::create();
          pIVar2 = *(IssueImpl **)(local_a0._M_dataplus._M_p + 8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_f8 + 0x28),"Reset referencing variable \'",&local_188);
          plVar7 = (long *)std::__cxx11::string::append((char *)(local_f8 + 0x28));
          local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_130;
          peVar9 = (element_type *)(plVar7 + 2);
          if ((element_type *)*plVar7 == peVar9) {
            local_130._vptr_Issue = peVar9->_vptr_Issue;
            local_130.mPimpl = (IssueImpl *)plVar7[3];
          }
          else {
            local_130._vptr_Issue = peVar9->_vptr_Issue;
            local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar7;
          }
          local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
          *plVar7 = (long)peVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    (&local_118,
                     (NamedEntity *)
                     (component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          pp_Var14 = (_func_int **)0xf;
          if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_130) {
            pp_Var14 = local_130._vptr_Issue;
          }
          pp_Var1 = (_func_int **)
                    ((long)&(local_140.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + local_118._M_string_length
                    );
          if (pp_Var14 < pp_Var1) {
            uVar5 = (_func_int **)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              uVar5 = local_118.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar5 < pp_Var1) goto LAB_0023e01e;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_118,0,(char *)0x0,
                                (ulong)local_140.
                                       super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
          }
          else {
LAB_0023e01e:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_140,(ulong)local_118._M_dataplus._M_p);
          }
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar12 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_1a8.field_2._M_allocated_capacity = *puVar12;
            local_1a8.field_2._8_8_ = puVar6[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar12;
            local_1a8._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_1a8._M_string_length = puVar6[1];
          *puVar6 = puVar12;
          puVar6[1] = 0;
          *(undefined1 *)puVar12 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          psVar11 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_160.field_2._M_allocated_capacity = *psVar11;
            local_160.field_2._8_8_ = puVar6[3];
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar11;
            local_160._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_160._M_string_length = puVar6[1];
          *puVar6 = psVar11;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar2,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_130) {
            operator_delete(local_140.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (long)local_130._vptr_Issue + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._40_8_ != &local_c0) {
            operator_delete((void *)local_f8._40_8_,local_c0._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setReset
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)(*(long *)(local_a0._M_dataplus._M_p + 8) + 0x28),local_120,
                     RESET);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)(local_a0._M_dataplus._M_p + 8),RESET_VARIABLE_REFERENCE);
          Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,(IssuePtr *)&local_a0);
LAB_0023e723:
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
          }
        }
        else {
          Reset::setVariable((local_120->
                             super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr,(VariablePtr *)local_f8);
        }
LAB_0023e735:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
        }
LAB_0023e747:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar10) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar4 = XmlAttribute::isType((XmlAttribute *)local_b0.mPimpl,"test_variable","");
        if (bVar4) {
          XmlAttribute::value_abi_cxx11_(&local_188,(XmlAttribute *)local_b0.mPimpl);
          Component::variable((Component *)local_f8,
                              (string *)
                              (component->
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            Reset::setTestVariable
                      ((local_120->super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr,(VariablePtr *)local_f8);
            goto LAB_0023e735;
          }
          Issue::IssueImpl::create();
          pIVar2 = *(IssueImpl **)(local_a0._M_dataplus._M_p + 8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_f8 + 0x28),"Reset referencing test_variable \'",&local_188);
          plVar7 = (long *)std::__cxx11::string::append((char *)(local_f8 + 0x28));
          local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_130;
          peVar9 = (element_type *)(plVar7 + 2);
          if ((element_type *)*plVar7 == peVar9) {
            local_130._vptr_Issue = peVar9->_vptr_Issue;
            local_130.mPimpl = (IssueImpl *)plVar7[3];
          }
          else {
            local_130._vptr_Issue = peVar9->_vptr_Issue;
            local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar7;
          }
          local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
          *plVar7 = (long)peVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    (&local_118,
                     (NamedEntity *)
                     (component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          pp_Var14 = (_func_int **)0xf;
          if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_130) {
            pp_Var14 = local_130._vptr_Issue;
          }
          pp_Var1 = (_func_int **)
                    ((long)&(local_140.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + local_118._M_string_length
                    );
          if (pp_Var14 < pp_Var1) {
            uVar5 = (_func_int **)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              uVar5 = local_118.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar5 < pp_Var1) goto LAB_0023e3ef;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_118,0,(char *)0x0,
                                (ulong)local_140.
                                       super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
          }
          else {
LAB_0023e3ef:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_140,(ulong)local_118._M_dataplus._M_p);
          }
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar12 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_1a8.field_2._M_allocated_capacity = *puVar12;
            local_1a8.field_2._8_8_ = puVar6[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar12;
            local_1a8._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_1a8._M_string_length = puVar6[1];
          *puVar6 = puVar12;
          puVar6[1] = 0;
          *(undefined1 *)puVar12 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          psVar11 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_160.field_2._M_allocated_capacity = *psVar11;
            local_160.field_2._8_8_ = puVar6[3];
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar11;
            local_160._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_160._M_string_length = puVar6[1];
          *puVar6 = psVar11;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar2,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_130) {
            operator_delete(local_140.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (long)local_130._vptr_Issue + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._40_8_ != &local_c0) {
            operator_delete((void *)local_f8._40_8_,local_c0._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setReset
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)(*(long *)(local_a0._M_dataplus._M_p + 8) + 0x28),local_120,
                     RESET);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)(local_a0._M_dataplus._M_p + 8),RESET_TEST_VARIABLE_REFERENCE);
          Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,(IssuePtr *)&local_a0);
          goto LAB_0023e723;
        }
        bVar4 = XmlAttribute::isType((XmlAttribute *)local_b0.mPimpl,"order","");
        if (bVar4) {
          XmlAttribute::value_abi_cxx11_(&local_188,(XmlAttribute *)local_b0.mPimpl);
          bVar4 = isCellMLInteger(&local_188);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar10) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if (bVar4) {
            XmlAttribute::value_abi_cxx11_(&local_188,(XmlAttribute *)local_b0.mPimpl);
            bVar4 = convertToInt(&local_188,&local_44);
            uVar8 = extraout_var;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != paVar10) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
              uVar8 = extraout_var_00;
            }
            local_40 = CONCAT71(uVar8,1);
            if (bVar4) {
              local_80 = CONCAT44(local_80._4_4_,(int)CONCAT71(uVar8,1));
              goto LAB_0023e75e;
            }
            local_188._M_string_length = 0;
            local_188.field_2._M_allocated_capacity =
                 local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_188._M_dataplus._M_p = (pointer)paVar10;
            Reset::variable((local_120->
                            super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           );
            _Var3._M_p = local_160._M_dataplus._M_p;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._M_string_length)
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var3._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              Reset::variable((local_120->
                              super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
              NamedEntity::name_abi_cxx11_(&local_160,(NamedEntity *)local_1a8._M_dataplus._M_p);
              std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_1a8._M_string_length);
              }
            }
            Issue::IssueImpl::create();
            pIVar2 = (local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl;
            NamedEntity::name_abi_cxx11_
                      (&local_a0,
                       (NamedEntity *)
                       (component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ;
            plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x2a70fa);
            local_f8._0_8_ = local_f8 + 0x10;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 == paVar10) {
              local_f8._16_8_ = paVar10->_M_allocated_capacity;
              local_f8._24_8_ = plVar7[3];
            }
            else {
              local_f8._16_8_ = paVar10->_M_allocated_capacity;
              local_f8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar7;
            }
            local_f8._8_8_ = plVar7[1];
            *plVar7 = (long)paVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append(local_f8);
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            plVar13 = plVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar13) {
              local_118.field_2._M_allocated_capacity = *plVar13;
              local_118.field_2._8_8_ = plVar7[3];
            }
            else {
              local_118.field_2._M_allocated_capacity = *plVar13;
              local_118._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_118._M_string_length = plVar7[1];
            *plVar7 = (long)plVar13;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_118,(ulong)local_188._M_dataplus._M_p);
            local_f8._40_8_ = &local_c0;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 == paVar10) {
              local_c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_c0._8_8_ = plVar7[3];
            }
            else {
              local_c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_f8._40_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar7;
            }
            local_c8 = plVar7[1];
            *plVar7 = (long)paVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append(local_f8 + 0x28);
            local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 &local_130;
            peVar9 = (element_type *)(plVar7 + 2);
            if ((element_type *)*plVar7 == peVar9) {
              local_130._vptr_Issue = peVar9->_vptr_Issue;
              local_130.mPimpl = (IssueImpl *)plVar7[3];
            }
            else {
              local_130._vptr_Issue = peVar9->_vptr_Issue;
              local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)*plVar7;
            }
            local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
            *plVar7 = (long)peVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            XmlAttribute::value_abi_cxx11_(&local_68,(XmlAttribute *)local_b0.mPimpl);
            pp_Var14 = (_func_int **)0xf;
            if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                &local_130) {
              pp_Var14 = local_130._vptr_Issue;
            }
            pp_Var1 = (_func_int **)
                      ((long)&(local_140.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base +
                      local_68._M_string_length);
            if (pp_Var14 < pp_Var1) {
              uVar5 = (_func_int **)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                uVar5 = local_68.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar5 < pp_Var1) goto LAB_0023f01d;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_68,0,(char *)0x0,
                                  (ulong)local_140.
                                         super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
            }
            else {
LAB_0023f01d:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_140,(ulong)local_68._M_dataplus._M_p);
            }
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            puVar12 = puVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_1a8.field_2._M_allocated_capacity = *puVar12;
              local_1a8.field_2._8_8_ = puVar6[3];
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *puVar12;
              local_1a8._M_dataplus._M_p = (pointer)*puVar6;
            }
            local_1a8._M_string_length = puVar6[1];
            *puVar6 = puVar12;
            puVar6[1] = 0;
            *(undefined1 *)puVar12 = 0;
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            psVar11 = puVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_160.field_2._M_allocated_capacity = *psVar11;
              local_160.field_2._8_8_ = puVar6[3];
            }
            else {
              local_160.field_2._M_allocated_capacity = *psVar11;
              local_160._M_dataplus._M_p = (pointer)*puVar6;
            }
            local_160._M_string_length = puVar6[1];
            *puVar6 = psVar11;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            Issue::IssueImpl::setDescription(pIVar2,&local_160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                &local_130) {
              operator_delete(local_140.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,(long)local_130._vptr_Issue + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._40_8_ != &local_c0) {
              operator_delete((void *)local_f8._40_8_,local_c0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_f8 + 0x10)) {
              operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            AnyCellmlElement::AnyCellmlElementImpl::setReset
                      ((((local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,local_120,RESET);
            Issue::IssueImpl::setReferenceRule
                      ((local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,RESET_ORDER_VALUE);
            Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,&local_78);
            if (local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            local_188._M_string_length = 0;
            local_188.field_2._M_allocated_capacity =
                 local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_188._M_dataplus._M_p = (pointer)paVar10;
            Reset::variable((local_120->
                            super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           );
            _Var3._M_p = local_160._M_dataplus._M_p;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._M_string_length)
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var3._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              Reset::variable((local_120->
                              super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
              NamedEntity::name_abi_cxx11_(&local_160,(NamedEntity *)local_1a8._M_dataplus._M_p);
              std::__cxx11::string::operator=((string *)&local_188,(string *)&local_160);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_1a8._M_string_length);
              }
            }
            Issue::IssueImpl::create();
            pIVar2 = (local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl;
            NamedEntity::name_abi_cxx11_
                      (&local_a0,
                       (NamedEntity *)
                       (component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ;
            plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x2a70fa);
            local_f8._0_8_ = local_f8 + 0x10;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 == paVar10) {
              local_f8._16_8_ = paVar10->_M_allocated_capacity;
              local_f8._24_8_ = plVar7[3];
            }
            else {
              local_f8._16_8_ = paVar10->_M_allocated_capacity;
              local_f8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar7;
            }
            local_f8._8_8_ = plVar7[1];
            *plVar7 = (long)paVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append(local_f8);
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            plVar13 = plVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar13) {
              local_118.field_2._M_allocated_capacity = *plVar13;
              local_118.field_2._8_8_ = plVar7[3];
            }
            else {
              local_118.field_2._M_allocated_capacity = *plVar13;
              local_118._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_118._M_string_length = plVar7[1];
            *plVar7 = (long)plVar13;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_118,(ulong)local_188._M_dataplus._M_p);
            local_f8._40_8_ = &local_c0;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 == paVar10) {
              local_c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_c0._8_8_ = plVar7[3];
            }
            else {
              local_c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_f8._40_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar7;
            }
            local_c8 = plVar7[1];
            *plVar7 = (long)paVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append(local_f8 + 0x28);
            local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 &local_130;
            peVar9 = (element_type *)(plVar7 + 2);
            if ((element_type *)*plVar7 == peVar9) {
              local_130._vptr_Issue = peVar9->_vptr_Issue;
              local_130.mPimpl = (IssueImpl *)plVar7[3];
            }
            else {
              local_130._vptr_Issue = peVar9->_vptr_Issue;
              local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)*plVar7;
            }
            local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
            *plVar7 = (long)peVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            XmlAttribute::value_abi_cxx11_(&local_68,(XmlAttribute *)local_b0.mPimpl);
            pp_Var14 = (_func_int **)0xf;
            if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                &local_130) {
              pp_Var14 = local_130._vptr_Issue;
            }
            pp_Var1 = (_func_int **)
                      ((long)&(local_140.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base +
                      local_68._M_string_length);
            if (pp_Var14 < pp_Var1) {
              uVar5 = (_func_int **)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                uVar5 = local_68.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar5 < pp_Var1) goto LAB_0023ea22;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_68,0,(char *)0x0,
                                  (ulong)local_140.
                                         super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
            }
            else {
LAB_0023ea22:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_140,(ulong)local_68._M_dataplus._M_p);
            }
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            puVar12 = puVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_1a8.field_2._M_allocated_capacity = *puVar12;
              local_1a8.field_2._8_8_ = puVar6[3];
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *puVar12;
              local_1a8._M_dataplus._M_p = (pointer)*puVar6;
            }
            local_1a8._M_string_length = puVar6[1];
            *puVar6 = puVar12;
            puVar6[1] = 0;
            *(undefined1 *)puVar12 = 0;
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            psVar11 = puVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_160.field_2._M_allocated_capacity = *psVar11;
              local_160.field_2._8_8_ = puVar6[3];
            }
            else {
              local_160.field_2._M_allocated_capacity = *psVar11;
              local_160._M_dataplus._M_p = (pointer)*puVar6;
            }
            local_160._M_string_length = puVar6[1];
            *puVar6 = psVar11;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            Issue::IssueImpl::setDescription(pIVar2,&local_160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                &local_130) {
              operator_delete(local_140.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,(long)local_130._vptr_Issue + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._40_8_ != &local_c0) {
              operator_delete((void *)local_f8._40_8_,local_c0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_f8 + 0x10)) {
              operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            AnyCellmlElement::AnyCellmlElementImpl::setReset
                      ((((local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,local_120,RESET);
            Issue::IssueImpl::setReferenceRule
                      ((local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,RESET_ORDER_VALUE);
            Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,&local_78);
            uVar5 = extraout_RAX;
            if (local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              uVar5 = extraout_RAX_00;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
              uVar5 = extraout_RAX_01;
            }
            local_40 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
          }
          local_80 = local_80 & 0xffffffff00000000;
        }
        else {
          bVar4 = XmlAttribute::isType((XmlAttribute *)local_b0.mPimpl,"id","");
          if (bVar4) {
            this_00 = (Entity *)
                      (local_120->super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
            XmlAttribute::value_abi_cxx11_(&local_188,(XmlAttribute *)local_b0.mPimpl);
            Entity::setId(this_00,&local_188);
            goto LAB_0023e747;
          }
          Issue::IssueImpl::create();
          this_01 = ((XmlNodeImpl *)(local_f8._0_8_ + 8))->mXmlNodePtr;
          NamedEntity::name_abi_cxx11_
                    ((string *)(local_f8 + 0x28),
                     (NamedEntity *)
                     (component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          plVar7 = (long *)std::__cxx11::string::replace
                                     ((ulong)(local_f8 + 0x28),0,(char *)0x0,0x2a70fa);
          local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_130;
          peVar9 = (element_type *)(plVar7 + 2);
          if ((element_type *)*plVar7 == peVar9) {
            local_130._vptr_Issue = peVar9->_vptr_Issue;
            local_130.mPimpl = (IssueImpl *)plVar7[3];
          }
          else {
            local_130._vptr_Issue = peVar9->_vptr_Issue;
            local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar7;
          }
          local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
          *plVar7 = (long)peVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar12 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_1a8.field_2._M_allocated_capacity = *puVar12;
            local_1a8.field_2._8_8_ = puVar6[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar12;
            local_1a8._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_1a8._M_string_length = puVar6[1];
          *puVar6 = puVar12;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          XmlAttribute::name_abi_cxx11_(&local_118,(XmlAttribute *)local_b0.mPimpl);
          uVar5 = (_func_int **)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            uVar5 = local_1a8.field_2._M_allocated_capacity;
          }
          pp_Var14 = (_func_int **)
                     ((long)(_func_int ***)local_1a8._M_string_length + local_118._M_string_length);
          if ((ulong)uVar5 < pp_Var14) {
            uVar5 = (_func_int **)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              uVar5 = local_118.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar5 < pp_Var14) goto LAB_0023e856;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_118,0,(char *)0x0,(ulong)local_1a8._M_dataplus._M_p);
          }
          else {
LAB_0023e856:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_1a8,(ulong)local_118._M_dataplus._M_p);
          }
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          psVar11 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_160.field_2._M_allocated_capacity = *psVar11;
            local_160.field_2._8_8_ = puVar6[3];
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar11;
            local_160._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_160._M_string_length = puVar6[1];
          *puVar6 = psVar11;
          puVar6[1] = 0;
          *(undefined1 *)psVar11 = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 == paVar10) {
            local_188.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_188.field_2._8_8_ = plVar7[3];
          }
          else {
            local_188.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_188._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_188._M_string_length = plVar7[1];
          *plVar7 = (long)paVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          Issue::IssueImpl::setDescription((IssueImpl *)this_01,&local_188);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_130) {
            operator_delete(local_140.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (long)local_130._vptr_Issue + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._40_8_ != &local_c0) {
            operator_delete((void *)local_f8._40_8_,local_c0._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setReset
                    ((AnyCellmlElementImpl *)
                     ((XmlNodeImpl *)(local_f8._0_8_ + 8))->mXmlNodePtr->parent->_private,local_120,
                     RESET);
          Issue::IssueImpl::setReferenceRule
                    ((IssueImpl *)((XmlNodeImpl *)(local_f8._0_8_ + 8))->mXmlNodePtr,
                     RESET_ATTRIBUTE_REQUIRED);
          Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,(IssuePtr *)local_f8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
          }
        }
      }
LAB_0023e75e:
      XmlAttribute::next((XmlAttribute *)&local_188);
      this_02 = local_a8;
      local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length;
      local_b0.mPimpl = (XmlNodeImpl *)local_188._M_dataplus._M_p;
      local_188._M_dataplus._M_p = (pointer)0x0;
      local_188._M_string_length = 0;
      if ((this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length);
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b0.mPimpl !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
    if ((local_80 & 1) != 0) {
      Reset::setOrder((local_120->super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr,local_44);
      goto LAB_0023f444;
    }
    if ((local_40 & 1) != 0) goto LAB_0023f444;
  }
  Issue::IssueImpl::create();
  pIVar2 = (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           mPimpl;
  NamedEntity::name_abi_cxx11_
            (&local_1a8,
             (NamedEntity *)
             (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x2a70fa);
  psVar11 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_160.field_2._M_allocated_capacity = *psVar11;
    local_160.field_2._8_8_ = puVar6[3];
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar11;
    local_160._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_160._M_string_length = puVar6[1];
  *puVar6 = psVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar10) {
    local_188.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_188.field_2._8_8_ = plVar7[3];
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  }
  else {
    local_188.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_188._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_188._M_string_length = plVar7[1];
  *plVar7 = (long)paVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  Issue::IssueImpl::setDescription(pIVar2,&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  AnyCellmlElement::AnyCellmlElementImpl::setReset
            ((((local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl->mItem).
              super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl,local_120,RESET);
  Issue::IssueImpl::setReferenceRule
            ((local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl,RESET_ORDER_VALUE);
  Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,&local_140);
  if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
LAB_0023f444:
  XmlNode::firstChild((XmlNode *)local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._0_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    count_00 = 0;
    count = 0;
  }
  else {
    count = 0;
    count_00 = 0;
    do {
      bVar4 = XmlNode::isCellml20Element((XmlNode *)local_f8._0_8_,"test_value");
      if (bVar4) {
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"test_value","");
        loadResetChild((ParserImpl *)local_f8._32_8_,&local_188,local_120,component,
                       (XmlNodePtr *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        count_00 = count_00 + 1;
      }
      else {
        bVar4 = XmlNode::isCellml20Element((XmlNode *)local_f8._0_8_,"reset_value");
        if (bVar4) {
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"reset_value","");
          loadResetChild((ParserImpl *)local_f8._32_8_,&local_188,local_120,component,
                         (XmlNodePtr *)local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          count = count + 1;
        }
        else {
          bVar4 = XmlNode::isText((XmlNode *)local_f8._0_8_);
          if (bVar4) {
            XmlNode::convertToString_abi_cxx11_(&local_188,(XmlNode *)local_f8._0_8_);
            bVar4 = hasNonWhitespaceCharacters(&local_188);
            if (bVar4) {
              Issue::IssueImpl::create();
              pIVar2 = (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl;
              std::operator+(&local_1a8,"Reset has an invalid non-whitespace child text element \'",
                             &local_188);
              puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              psVar11 = puVar6 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_160.field_2._M_allocated_capacity = *psVar11;
                local_160.field_2._8_8_ = puVar6[3];
              }
              else {
                local_160.field_2._M_allocated_capacity = *psVar11;
                local_160._M_dataplus._M_p = (pointer)*puVar6;
              }
              local_160._M_string_length = puVar6[1];
              *puVar6 = psVar11;
              puVar6[1] = 0;
              *(undefined1 *)(puVar6 + 2) = 0;
              Issue::IssueImpl::setDescription(pIVar2,&local_160);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              AnyCellmlElement::AnyCellmlElementImpl::setReset
                        ((((local_140.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,local_120,RESET);
              Issue::IssueImpl::setReferenceRule
                        ((local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,XML_UNEXPECTED_CHARACTER);
              Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,&local_140);
              if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_140.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            bVar4 = XmlNode::isComment((XmlNode *)local_f8._0_8_);
            if (!bVar4) {
              local_80 = count;
              Issue::IssueImpl::create();
              pIVar2 = *(IssueImpl **)(local_a0._M_dataplus._M_p + 8);
              NamedEntity::name_abi_cxx11_
                        ((string *)(local_f8 + 0x28),
                         (NamedEntity *)
                         (component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
              plVar7 = (long *)std::__cxx11::string::replace
                                         ((ulong)(local_f8 + 0x28),0,(char *)0x0,0x2a70fa);
              local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   &local_130;
              peVar9 = (element_type *)(plVar7 + 2);
              if ((element_type *)*plVar7 == peVar9) {
                local_130._vptr_Issue = peVar9->_vptr_Issue;
                local_130.mPimpl = (IssueImpl *)plVar7[3];
              }
              else {
                local_130._vptr_Issue = peVar9->_vptr_Issue;
                local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)*plVar7;
              }
              local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
              *plVar7 = (long)peVar9;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              puVar12 = puVar6 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar12) {
                local_1a8.field_2._M_allocated_capacity = *puVar12;
                local_1a8.field_2._8_8_ = puVar6[3];
              }
              else {
                local_1a8.field_2._M_allocated_capacity = *puVar12;
                local_1a8._M_dataplus._M_p = (pointer)*puVar6;
              }
              local_1a8._M_string_length = puVar6[1];
              *puVar6 = puVar12;
              puVar6[1] = 0;
              *(undefined1 *)(puVar6 + 2) = 0;
              XmlNode::name_abi_cxx11_(&local_118,(XmlNode *)local_f8._0_8_);
              uVar5 = (_func_int **)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                uVar5 = local_1a8.field_2._M_allocated_capacity;
              }
              pp_Var14 = (_func_int **)
                         ((long)(_func_int ***)local_1a8._M_string_length +
                         local_118._M_string_length);
              if ((ulong)uVar5 < pp_Var14) {
                uVar5 = (_func_int **)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  uVar5 = local_118.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar5 < pp_Var14) goto LAB_0023f850;
                puVar6 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_118,0,(char *)0x0,
                                    (ulong)local_1a8._M_dataplus._M_p);
              }
              else {
LAB_0023f850:
                puVar6 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_1a8,(ulong)local_118._M_dataplus._M_p);
              }
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              psVar11 = puVar6 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_160.field_2._M_allocated_capacity = *psVar11;
                local_160.field_2._8_8_ = puVar6[3];
              }
              else {
                local_160.field_2._M_allocated_capacity = *psVar11;
                local_160._M_dataplus._M_p = (pointer)*puVar6;
              }
              local_160._M_string_length = puVar6[1];
              *puVar6 = psVar11;
              puVar6[1] = 0;
              *(undefined1 *)psVar11 = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 == paVar10) {
                local_188.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                local_188.field_2._8_8_ = plVar7[3];
              }
              else {
                local_188.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                local_188._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_188._M_string_length = plVar7[1];
              *plVar7 = (long)paVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              Issue::IssueImpl::setDescription(pIVar2,&local_188);
              count = local_80;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if (local_140.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != &local_130) {
                operator_delete(local_140.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,(long)local_130._vptr_Issue + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._40_8_ != &local_c0) {
                operator_delete((void *)local_f8._40_8_,local_c0._M_allocated_capacity + 1);
              }
              AnyCellmlElement::AnyCellmlElementImpl::setReset
                        ((AnyCellmlElementImpl *)
                         **(undefined8 **)(*(long *)(local_a0._M_dataplus._M_p + 8) + 0x28),
                         local_120,RESET);
              Issue::IssueImpl::setReferenceRule
                        (*(IssueImpl **)(local_a0._M_dataplus._M_p + 8),XML_UNEXPECTED_ELEMENT);
              Logger::LoggerImpl::addIssue((LoggerImpl *)local_f8._32_8_,(IssuePtr *)&local_a0);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length
                          );
              }
            }
          }
        }
      }
      XmlNode::next((XmlNode *)&local_188);
      uVar5 = local_f8._8_8_;
      local_f8._8_8_ = local_188._M_string_length;
      local_f8._0_8_ = local_188._M_dataplus._M_p;
      local_188._M_dataplus._M_p = (pointer)0x0;
      local_188._M_string_length = 0;
      if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length);
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_f8._0_8_ !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
  }
  paVar10 = &local_188.field_2;
  local_188._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"test_value","");
  checkResetChildMultiplicity((ParserImpl *)local_f8._32_8_,count_00,&local_188,local_120,component)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar10) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  local_188._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"reset_value","");
  checkResetChildMultiplicity((ParserImpl *)local_f8._32_8_,count,&local_188,local_120,component);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar10) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  return;
}

Assistant:

void Parser::ParserImpl::loadReset(const ResetPtr &reset, const ComponentPtr &component, const XmlNodePtr &node)
{
    int order = 0;
    bool orderValid = false;
    bool orderDefined = false;

    XmlAttributePtr attribute = node->firstAttribute();
    while (attribute != nullptr) {
        if (attribute->isType("variable")) {
            const std::string variableReference = attribute->value();
            VariablePtr referencedVariable = component->variable(variableReference);

            if (referencedVariable == nullptr) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset referencing variable '" + variableReference + "' is not a valid reference for a variable in component '" + component->name() + "'.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_VARIABLE_REFERENCE);
                addIssue(issue);
            } else {
                reset->setVariable(referencedVariable);
            }
        } else if (attribute->isType("test_variable")) {
            const std::string testVariableReference = attribute->value();
            VariablePtr testVariable = component->variable(testVariableReference);
            if (testVariable == nullptr) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset referencing test_variable '" + testVariableReference + "' is not a valid reference for a variable in component '" + component->name() + "'.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_TEST_VARIABLE_REFERENCE);
                addIssue(issue);
            } else {
                reset->setTestVariable(testVariable);
            }
        } else if (attribute->isType("order")) {
            orderDefined = true;
            orderValid = isCellMLInteger(attribute->value());
            if (orderValid) {
                orderValid = convertToInt(attribute->value(), order);
                if (!orderValid) {
                    std::string variableName;
                    if (reset->variable() != nullptr) {
                        variableName = reset->variable()->name();
                    }
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Reset in component '" + component->name() + "' referencing variable '" + variableName + "' has an out of range integer order value '" + attribute->value() + "'.");
                    issue->mPimpl->mItem->mPimpl->setReset(reset);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_VALUE);
                    addIssue(issue);
                }
            } else { // This value won't be saved for validation later, so it does need to be reported now.
                std::string variableName;
                if (reset->variable() != nullptr) {
                    variableName = reset->variable()->name();
                }
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset in component '" + component->name() + "' referencing variable '" + variableName + "' has a non-integer order value '" + attribute->value() + "'.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_VALUE);
                addIssue(issue);
            }
        } else if (attribute->isType("id")) {
            reset->setId(attribute->value());
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Reset in component '" + component->name() + "' has an invalid attribute '" + attribute->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setReset(reset);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ATTRIBUTE_REQUIRED);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (orderValid) {
        reset->setOrder(order);
    } else if (!orderDefined) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Reset in component '" + component->name() + "' does not have its order set.");
        issue->mPimpl->mItem->mPimpl->setReset(reset);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_VALUE);
        addIssue(issue);
    }

    XmlNodePtr childNode = node->firstChild();

    size_t testValueCount = 0;
    size_t resetValueCount = 0;
    while (childNode != nullptr) {
        if (childNode->isCellml20Element("test_value")) {
            loadResetChild("test_value", reset, component, childNode);
            testValueCount++;
        } else if (childNode->isCellml20Element("reset_value")) {
            loadResetChild("reset_value", reset, component, childNode);
            resetValueCount++;
        } else if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset has an invalid non-whitespace child text element '" + textNode + "'. Either a test_value block or a reset_value block is expected.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Reset in component '" + component->name() + "' has an invalid child '" + childNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setReset(reset);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            addIssue(issue);
        }
        childNode = childNode->next();
    }

    checkResetChildMultiplicity(testValueCount, "test_value", reset, component);
    checkResetChildMultiplicity(resetValueCount, "reset_value", reset, component);
}